

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O3

void __thiscall
args::Group::Group(Group *this,Group *group_,string *help_,
                  function<bool_(const_args::Group_&)> *validator_)

{
  pointer pcVar1;
  
  (this->super_Base)._vptr_Base = (_func_int **)&PTR__Base_001338e0;
  (this->super_Base).matched = false;
  (this->super_Base).help._M_dataplus._M_p = (pointer)&(this->super_Base).help.field_2;
  pcVar1 = (help_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_Base).help,pcVar1,pcVar1 + help_->_M_string_length);
  (this->super_Base)._vptr_Base = (_func_int **)&PTR__Group_001338a8;
  (this->children).super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->children).super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->children).super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::function<bool_(const_args::Group_&)>::function(&this->validator,validator_);
  Add(group_,&this->super_Base);
  return;
}

Assistant:

Group(Group &group_, const std::string &help_ = std::string(), const std::function<bool(const Group &)> &validator_ = Validators::DontCare) : Base(help_), validator(validator_)
            {
                group_.Add(*this);
            }